

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::makeDirect(QPDFObjectHandle *this,set *visited,bool stop_at_streams)

{
  element_type *peVar1;
  bool bVar2;
  iterator __args;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  mapped_type *this_00;
  runtime_error *prVar6;
  code *pcVar7;
  undefined *puVar8;
  QPDFObjectHandle *item;
  QPDFObjGen og;
  QPDFObjectHandle local_c8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> items;
  Array a;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  local_60;
  
  assertInitialized(this);
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    og.obj = 0;
    og.gen = 0;
  }
  else {
    og = peVar1->og;
  }
  bVar2 = QPDFObjGen::set::add(visited,og);
  if (!bVar2) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar6,"loop detected while converting object from indirect to direct");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = isBool(this);
  if (!bVar2) {
    bVar2 = isInteger(this);
    if (!bVar2) {
      bVar2 = isName(this);
      if (!bVar2) {
        bVar2 = isNull(this);
        if (!bVar2) {
          bVar2 = isReal(this);
          if (!bVar2) {
            bVar2 = isString(this);
            if (!bVar2) {
              as_array(&a,this,strict);
              if (a.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                bVar2 = isDictionary(this);
                if (bVar2) {
                  items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       (pointer)((ulong)items.
                                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                        ._M_impl.super__Vector_impl_data._M_finish &
                                0xffffffff00000000);
                  items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  as_dictionary(&local_c8,(typed)this);
                  iVar4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_c8);
                  iVar5 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_c8);
                  for (; iVar4._M_node != iVar5._M_node;
                      iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
                    bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar4._M_node + 2));
                    if (!bVar2) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                      ::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_true>
                                (&local_60,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(iVar4._M_node + 1),(QPDFObjectHandle *)(iVar4._M_node + 2));
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,QPDFObjectHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
                      ::_M_insert_unique<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>
                                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,QPDFObjectHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
                                  *)&items,&local_60);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                      ::~pair(&local_60);
                      this_00 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                              *)&items,(key_type *)(iVar4._M_node + 1));
                      makeDirect(this_00,visited,stop_at_streams);
                    }
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_c8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  QPDFObject::
                  create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>&>
                            ((QPDFObject *)&local_60,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                              *)&items);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_60.first._M_string_length);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                               *)&items);
                }
                else {
                  bVar2 = isStream(this);
                  if (!bVar2) {
                    bVar2 = isReserved(this);
                    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                    if (bVar2) {
                      std::logic_error::logic_error
                                ((logic_error *)prVar6,
                                 "QPDFObjectHandle: attempting to make a reserved object handle direct"
                                );
                    }
                    else {
                      std::logic_error::logic_error
                                ((logic_error *)prVar6,
                                 "QPDFObjectHandle::makeDirectInternal: unknown object type");
                    }
                    pcVar7 = std::logic_error::~logic_error;
                    puVar8 = &std::logic_error::typeinfo;
LAB_0019c88c:
                    __cxa_throw(prVar6,puVar8,pcVar7);
                  }
                  if (!stop_at_streams) {
                    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (prVar6,"attempt to make a stream into a direct object");
                    pcVar7 = std::runtime_error::~runtime_error;
                    puVar8 = &std::runtime_error::typeinfo;
                    goto LAB_0019c88c;
                  }
                }
              }
              else {
                items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                __args = ::qpdf::Array::begin(&a);
                iVar3 = ::qpdf::Array::end(&a);
                for (; __args._M_current != iVar3._M_current;
                    __args._M_current = __args._M_current + 1) {
                  std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
                  emplace_back<QPDFObjectHandle_const&>
                            ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&items,
                             __args._M_current);
                  makeDirect(items.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1,visited,stop_at_streams
                            );
                }
                QPDFObject::
                create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&>
                          ((QPDFObject *)&local_60,&items);
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &local_60.first._M_string_length);
                std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&items);
              }
              ::qpdf::Array::~Array(&a);
              goto LAB_0019c5e8;
            }
          }
        }
      }
    }
  }
  ::qpdf::BaseHandle::copy((BaseHandle *)&items,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)0x1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
              super__Vector_impl_data._M_finish);
LAB_0019c5e8:
  QPDFObjGen::set::erase(visited,og);
  return;
}

Assistant:

void
QPDFObjectHandle::makeDirect(QPDFObjGen::set& visited, bool stop_at_streams)
{
    assertInitialized();

    auto cur_og = getObjGen();
    if (!visited.add(cur_og)) {
        QTC::TC("qpdf", "QPDFObjectHandle makeDirect loop");
        throw std::runtime_error("loop detected while converting object from indirect to direct");
    }

    if (isBool() || isInteger() || isName() || isNull() || isReal() || isString()) {
        this->obj = copy(true);
    } else if (auto a = as_array(strict)) {
        std::vector<QPDFObjectHandle> items;
        for (auto const& item: a) {
            items.emplace_back(item);
            items.back().makeDirect(visited, stop_at_streams);
        }
        this->obj = QPDFObject::create<QPDF_Array>(items);
    } else if (isDictionary()) {
        std::map<std::string, QPDFObjectHandle> items;
        for (auto const& [key, value]: as_dictionary(strict)) {
            if (!value.null()) {
                items.insert({key, value});
                items[key].makeDirect(visited, stop_at_streams);
            }
        }
        this->obj = QPDFObject::create<QPDF_Dictionary>(items);
    } else if (isStream()) {
        QTC::TC("qpdf", "QPDFObjectHandle copy stream", stop_at_streams ? 0 : 1);
        if (!stop_at_streams) {
            throw std::runtime_error("attempt to make a stream into a direct object");
        }
    } else if (isReserved()) {
        throw std::logic_error(
            "QPDFObjectHandle: attempting to make a reserved object handle direct");
    } else {
        throw std::logic_error("QPDFObjectHandle::makeDirectInternal: unknown object type");
    }

    visited.erase(cur_og);
}